

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

void textblock_resize_if_needed(textblock *tb,size_t additional_size)

{
  wchar_t *pwVar1;
  uint8_t *puVar2;
  size_t remaining;
  size_t additional_size_local;
  textblock *tb_local;
  
  if (tb->size - tb->strlen < additional_size) {
    tb->size = tb->strlen + additional_size + 0x80;
    pwVar1 = (wchar_t *)mem_realloc(tb->text,tb->size << 2);
    tb->text = pwVar1;
    puVar2 = (uint8_t *)mem_realloc(tb->attrs,tb->size);
    tb->attrs = puVar2;
  }
  return;
}

Assistant:

static void textblock_resize_if_needed(textblock *tb, size_t additional_size)
{
	size_t remaining = tb->size - tb->strlen;

	/* If we need more room, reallocate it */
	if (remaining < additional_size) {
		tb->size = TEXTBLOCK_LEN_INCR(tb->strlen + additional_size);
		tb->text = mem_realloc(tb->text, tb->size * sizeof *tb->text);
		tb->attrs = mem_realloc(tb->attrs, tb->size);
	}
}